

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  Context *context;
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  ImmutableFieldGenerator *pIVar6;
  int i_00;
  int i_01;
  Descriptor *descriptor;
  ulong uVar7;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  undefined8 extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_04;
  long lVar9;
  int iVar10;
  char *text;
  string *this_01;
  Descriptor *pDVar11;
  int i;
  long lVar12;
  java *this_02;
  ImmutableMessageGenerator *pIVar13;
  ImmutableMessageGenerator *pIVar14;
  ImmutableMessageGenerator messageGenerator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_268;
  long local_248;
  SubstituteArg local_240;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  string builder_type;
  string local_1c0;
  string local_1a0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&messageGenerator,"static",(allocator<char> *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&messageGenerator,"classname",(allocator<char> *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,
             descriptor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars,"extra_interfaces",(allocator<char> *)&local_240);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&vars);
  std::__cxx11::string::~string((string *)&messageGenerator);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars,"ver",(allocator<char> *)&local_240);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&vars);
  std::__cxx11::string::~string((string *)&messageGenerator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&messageGenerator,"deprecation",(allocator<char> *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  pIVar13 = this;
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar11 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&messageGenerator,"",(allocator<char> *)&vars);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar11,true,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)((pIVar13->super_MessageGenerator).descriptor_ + 0x68) < 1) {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",(pIVar13->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,&variables,
                       "    com.google.protobuf.GeneratedMessage$ver$ implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    GeneratedCodeVersionSuffix_abi_cxx11_();
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_268._M_dataplus._M_p;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    messageGenerator.super_MessageGenerator.descriptor_._0_4_ =
         (undefined4)local_268._M_string_length;
    local_150.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_1a0,(strings *)"com.google.protobuf.GeneratedMessage$0.Builder<?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,&local_240,&local_180,&local_60,
               &local_90,&local_c0,&local_f0,&local_120,&local_150,(SubstituteArg *)pIVar13);
    this_01 = &local_1a0;
    std::__cxx11::string::operator=((string *)&builder_type,(string *)this_01);
  }
  else {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",(pIVar13->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,&variables,
                       "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n      $classname$> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_268,pIVar13->name_resolver_,(pIVar13->super_MessageGenerator).descriptor_);
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_268._M_dataplus._M_p;
    messageGenerator.super_MessageGenerator.descriptor_._0_4_ =
         (undefined4)local_268._M_string_length;
    GeneratedCodeVersionSuffix_abi_cxx11_();
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    vars._M_t._M_impl._0_8_ = local_1c0._M_dataplus._M_p;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)local_1c0._M_string_length;
    local_150.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_1a0,
               (strings *)"com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,&local_240,&local_180,&local_60,
               &local_90,&local_c0,&local_f0,&local_120,&local_150,(SubstituteArg *)pIVar13);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    this_01 = &local_1c0;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&local_268);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
                     ,"classname",*(string **)(pIVar13->super_MessageGenerator).descriptor_,
                     "buildertype",&builder_type);
  io::Printer::Print(printer,"private $classname$() {\n","classname",
                     *(string **)(pIVar13->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  GenerateInitializers(pIVar13,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,
                     "@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\ngetUnknownFields() {\n"
                    );
  text = "  return this.unknownFields;\n";
  if (*(int *)(*(long *)((pIVar13->super_MessageGenerator).descriptor_ + 0x10) + 0x8c) == 3) {
    text = "  return com.google.protobuf.UnknownFieldSet.getDefaultInstance();\n";
  }
  io::Printer::Print(printer,text);
  io::Printer::Print(printer,"}\n");
  bVar3 = Context::HasGeneratedMethods
                    (pIVar13->context_,(pIVar13->super_MessageGenerator).descriptor_);
  if (bVar3) {
    GenerateParsingConstructor(pIVar13,printer);
  }
  GenerateDescriptorMethods(pIVar13,printer);
  lVar9 = 0;
  for (lVar12 = 0; pDVar11 = (pIVar13->super_MessageGenerator).descriptor_,
      lVar12 < *(int *)(pDVar11 + 0x58); lVar12 = lVar12 + 1) {
    EnumGenerator::EnumGenerator
              ((EnumGenerator *)&messageGenerator,
               (EnumDescriptor *)(*(long *)(pDVar11 + 0x60) + lVar9),true,pIVar13->context_);
    EnumGenerator::Generate((EnumGenerator *)&messageGenerator,printer);
    EnumGenerator::~EnumGenerator((EnumGenerator *)&messageGenerator);
    lVar9 = lVar9 + 0x38;
  }
  lVar9 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(pDVar11 + 0x48); lVar12 = lVar12 + 1) {
    if (*(char *)(*(long *)(*(long *)(pDVar11 + 0x50) + 0x20 + lVar9) + 0x6b) == '\0') {
      ImmutableMessageGenerator
                (&messageGenerator,(Descriptor *)(*(long *)(pDVar11 + 0x50) + lVar9),
                 pIVar13->context_);
      GenerateInterface(&messageGenerator,printer);
      Generate(&messageGenerator,printer);
      ~ImmutableMessageGenerator(&messageGenerator);
      pDVar11 = (pIVar13->super_MessageGenerator).descriptor_;
    }
    lVar9 = lVar9 + 0xa8;
  }
  if ((*(int *)(*(long *)(pDVar11 + 0x10) + 0x8c) != 3) ||
     (bVar3 = HasRepeatedFields(pDVar11), bVar3)) {
    this_00 = &pIVar13->field_generators_;
    lVar9 = 0;
    iVar10 = 0;
    for (lVar12 = 0; pDVar11 = (pIVar13->super_MessageGenerator).descriptor_,
        lVar12 < *(int *)(pDVar11 + 0x2c); lVar12 = lVar12 + 1) {
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,(FieldDescriptor *)(*(long *)(pDVar11 + 0x30) + lVar9));
      iVar4 = (*pIVar6->_vptr_ImmutableFieldGenerator[2])(pIVar6);
      iVar10 = iVar10 + iVar4;
      lVar9 = lVar9 + 0xa8;
    }
    iVar4 = (iVar10 + 0x1f) / 0x20;
    uVar7 = (long)(iVar10 + 0x1f) % 0x20 & 0xffffffff;
    this_02 = (java *)0x0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != (int)this_02; this_02 = (java *)(ulong)((int)this_02 + 1)) {
      GetBitFieldName_abi_cxx11_((string *)&messageGenerator,this_02,(int)uVar7);
      io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                         (string *)&messageGenerator);
      std::__cxx11::string::~string((string *)&messageGenerator);
      uVar7 = extraout_RDX;
    }
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar9 = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pDVar11 = (pIVar13->super_MessageGenerator).descriptor_, lVar9 < *(int *)(pDVar11 + 0x38))
  {
    lVar12 = lVar9 * 0x30;
    local_248 = lVar9;
    Context::GetOneofGeneratorInfo
              (pIVar13->context_,(OneofDescriptor *)(*(long *)(pDVar11 + 0x40) + lVar12));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&messageGenerator,"oneof_name",(allocator<char> *)&local_240);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&messageGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&messageGenerator);
    Context::GetOneofGeneratorInfo
              (pIVar13->context_,
               (OneofDescriptor *)
               (*(long *)((pIVar13->super_MessageGenerator).descriptor_ + 0x40) + lVar12));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&messageGenerator,"oneof_capitalized_name",(allocator<char> *)&local_240);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&messageGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&messageGenerator);
    lVar9 = *(long *)((pIVar13->super_MessageGenerator).descriptor_ + 0x40);
    lVar9 = (lVar9 + lVar12) - *(long *)(*(long *)(lVar9 + 0x10 + lVar12) + 0x40);
    SimpleItoa_abi_cxx11_
              ((string *)&messageGenerator,(protobuf *)(lVar9 / 0x30 & 0xffffffff),
               (int)(lVar9 % 0x30));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"oneof_index",(allocator<char> *)&local_180);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_240);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&messageGenerator);
    io::Printer::Print(printer,&vars,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(printer,&vars,
                       "public enum $oneof_capitalized_name$Case\n    implements com.google.protobuf.Internal.EnumLite {\n"
                      );
    io::Printer::Indent(printer);
    for (lVar9 = 0; lVar1 = *(long *)((pIVar13->super_MessageGenerator).descriptor_ + 0x40),
        lVar9 < *(int *)(lVar1 + 0x1c + lVar12); lVar9 = lVar9 + 1) {
      puVar2 = *(undefined8 **)(*(long *)(lVar1 + lVar12 + 0x20) + lVar9 * 8);
      ToUpper((string *)&messageGenerator,(string *)*puVar2);
      SimpleItoa_abi_cxx11_((string *)&local_240,(protobuf *)(ulong)*(uint *)(puVar2 + 7),i_00);
      io::Printer::Print(printer,"$field_name$($field_number$),\n","field_name",
                         (string *)&messageGenerator,"field_number",(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&messageGenerator);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"oneof_name",(allocator<char> *)&local_180);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_240);
    ToUpper((string *)&messageGenerator,pmVar5);
    io::Printer::Print(printer,"$cap_oneof_name$_NOT_SET(0);\n","cap_oneof_name",
                       (string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_240);
    io::Printer::Print(printer,&vars,
                       "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                      );
    io::Printer::Print(printer,&vars,
                       "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                      );
    uVar8 = extraout_RDX_00;
    for (lVar9 = 0; lVar1 = *(long *)((pIVar13->super_MessageGenerator).descriptor_ + 0x40),
        lVar9 < *(int *)(lVar1 + 0x1c + lVar12); lVar9 = lVar9 + 1) {
      puVar2 = *(undefined8 **)(*(long *)(lVar1 + lVar12 + 0x20) + lVar9 * 8);
      SimpleItoa_abi_cxx11_
                ((string *)&messageGenerator,(protobuf *)(ulong)*(uint *)(puVar2 + 7),(int)uVar8);
      ToUpper((string *)&local_240,(string *)*puVar2);
      io::Printer::Print(printer,"    case $field_number$: return $field_name$;\n","field_number",
                         (string *)&messageGenerator,"field_name",(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&messageGenerator);
      uVar8 = extraout_RDX_01;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"oneof_name",(allocator<char> *)&local_180);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_240);
    ToUpper((string *)&messageGenerator,pmVar5);
    io::Printer::Print(printer,
                       "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                       ,"cap_oneof_name",(string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_240);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"};\n\n");
    io::Printer::Print(printer,&vars,
                       "public $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\n"
                      );
    lVar9 = local_248 + 1;
  }
  pIVar14 = pIVar13;
  bVar3 = IsAnyMessage(pDVar11);
  field = extraout_RDX_02;
  if (bVar3) {
    io::Printer::Print(printer,
                       "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  if (!is(clazz)) {\n    throw new com.google.protobuf.InvalidProtocolBufferException(\n        \"Type of the Any message does not match the given class.\");\n  }\n  if (cachedUnpackValue != null) {\n    return (T) cachedUnpackValue;\n ..." /* TRUNCATED STRING LITERAL */
                      );
    field = extraout_RDX_03;
  }
  lVar9 = 0;
  for (lVar12 = 0; pDVar11 = (pIVar14->super_MessageGenerator).descriptor_,
      lVar12 < *(int *)(pDVar11 + 0x2c); lVar12 = lVar12 + 1) {
    FieldConstantName_abi_cxx11_
              ((string *)&messageGenerator,(java *)(*(long *)(pDVar11 + 0x30) + lVar9),field);
    SimpleItoa_abi_cxx11_
              ((string *)&local_240,
               (protobuf *)
               (ulong)*(uint *)(*(long *)((pIVar14->super_MessageGenerator).descriptor_ + 0x30) +
                                0x38 + lVar9),i_01);
    io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                       "constant_name",(string *)&messageGenerator,"number",(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&messageGenerator);
    pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&pIVar13->field_generators_,
                        (FieldDescriptor *)
                        (*(long *)((pIVar14->super_MessageGenerator).descriptor_ + 0x30) + lVar9));
    (*pIVar6->_vptr_ImmutableFieldGenerator[5])(pIVar6,printer);
    io::Printer::Print(printer,"\n");
    lVar9 = lVar9 + 0xa8;
    field = extraout_RDX_04;
  }
  pIVar13 = pIVar14;
  bVar3 = Context::HasGeneratedMethods(pIVar14->context_,pDVar11);
  if (bVar3) {
    GenerateIsInitialized(pIVar14,printer);
    GenerateMessageSerializationMethods(pIVar14,printer);
    GenerateEqualsAndHashCode(pIVar14,printer);
  }
  GenerateParseFromMethods(pIVar14,printer);
  GenerateBuilder(pIVar14,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)((pIVar14->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,pIVar14->name_resolver_,
             (pIVar14->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"private static final $classname$ DEFAULT_INSTANCE;\n","classname",
                     (string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,pIVar13->name_resolver_,
             (pIVar13->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n","classname",
                     (string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,pIVar13->name_resolver_,
             (pIVar13->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  pIVar14 = pIVar13;
  GenerateParser(pIVar13,printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,pIVar13->name_resolver_,
             (pIVar13->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "public $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  lVar9 = 0;
  for (lVar12 = 0; pDVar11 = (pIVar14->super_MessageGenerator).descriptor_,
      lVar12 < *(int *)(pDVar11 + 0x78); lVar12 = lVar12 + 1) {
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)&messageGenerator,
               (FieldDescriptor *)(*(long *)(pDVar11 + 0x80) + lVar9),pIVar14->context_);
    ImmutableExtensionGenerator::Generate((ImmutableExtensionGenerator *)&messageGenerator,printer);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)&messageGenerator);
    lVar9 = lVar9 + 0xa8;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::__cxx11::string::~string((string *)&builder_type);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<string, string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] = descriptor_->options().deprecated()
      ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
      "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$0.Builder<?>",
        GeneratedCodeVersionSuffix());
  }
  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
    "// Use $classname$.newBuilder() to construct.\n"
    "private $classname$($buildertype$ builder) {\n"
    "  super(builder);\n"
    "}\n",
    "classname", descriptor_->name(),
    "buildertype", builder_type);
  printer->Print(
    "private $classname$() {\n",
    "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  printer->Print(
    "@java.lang.Override\n"
    "public final com.google.protobuf.UnknownFieldSet\n"
    "getUnknownFields() {\n");
  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "  return this.unknownFields;\n");
  } else {
    printer->Print(
      "  return com.google.protobuf.UnknownFieldSet.getDefaultInstance();\n");
  }
  printer->Print(
    "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(
        descriptor_->nested_type(i), context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->capitalized_name;
    vars["oneof_index"] = SimpleItoa(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars,
      "public enum $oneof_capitalized_name$Case\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "$field_name$($field_number$),\n",
        "field_name",
        ToUpper(field->name()),
        "field_number",
        SimpleItoa(field->number()));
    }
    printer->Print(
      "$cap_oneof_name$_NOT_SET(0);\n",
      "cap_oneof_name",
      ToUpper(vars["oneof_name"]));
    printer->Print(vars,
      "private final int value;\n"
      "private $oneof_capitalized_name$Case(int value) {\n"
      "  this.value = value;\n"
      "}\n");
    printer->Print(vars,
      "/**\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
      "  switch (value) {\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "    case $field_number$: return $field_name$;\n",
        "field_number",
        SimpleItoa(field->number()),
        "field_name",
        ToUpper(field->name()));
    }
    printer->Print(
      "    case 0: return $cap_oneof_name$_NOT_SET;\n"
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "public int getNumber() {\n"
      "  return this.value;\n"
      "}\n",
      "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());


  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "private static final $classname$ DEFAULT_INSTANCE;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
    "static {\n"
    "  DEFAULT_INSTANCE = new $classname$();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateParser(printer);

  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return DEFAULT_INSTANCE;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}